

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O0

void __thiscall BOWFileParser::makeDocVoca(BOWFileParser *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  value_type_conflict1 local_38;
  value_type_conflict1 local_34;
  undefined1 local_30 [4];
  int v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> docVocad;
  int d;
  BOWFileParser *this_local;
  
  docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar2 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(&this->_frequencyMatrix);
    if (sVar2 <= uVar1) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
    local_34 = 0;
    while( true ) {
      uVar1 = (ulong)(int)local_34;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_frequencyMatrix,
                            (long)docVocad.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
      if (sVar2 <= uVar1) break;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_frequencyMatrix,
                            (long)docVocad.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(long)(int)local_34);
      if (*pvVar4 != 0) {
        local_38 = local_34;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,&local_38);
      }
      local_34 = local_34 + 1;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&this->_docVoca,(value_type *)local_30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
    docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  return;
}

Assistant:

void BOWFileParser::makeDocVoca(){//{{{
    for(int d=0; d<_frequencyMatrix.size(); d++){
        vector<unsigned int> docVocad;
        for(int v=0; v<_frequencyMatrix[d].size(); v++){
            if(_frequencyMatrix[d][v] > 0){
                docVocad.push_back(v);
            }
        }
        _docVoca.push_back(docVocad);
    }
}